

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

CFG * __thiscall CFG::toDOT_abi_cxx11_(CFG *this)

{
  CfgNode *this_00;
  CfgNode *this_01;
  bool bVar1;
  Type TVar2;
  int iVar3;
  ostream *poVar4;
  reference ppCVar5;
  BlockData *this_02;
  void *pvVar6;
  list<Instruction_*,_std::allocator<Instruction_*>_> *__x;
  reference ppIVar7;
  set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *psVar8;
  reference ppCVar9;
  Data *pDVar10;
  set<CfgNode::Edge,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_> *psVar11;
  Addr AVar12;
  pointer pEVar13;
  CFG *in_RSI;
  CfgNode *succ;
  iterator ed_3;
  iterator it_3;
  set<CfgNode::Edge,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_> succs;
  PhantomData *phantomData;
  string local_2b8 [32];
  CFG *local_298;
  CFG *called;
  const_iterator ed_2;
  const_iterator it_2;
  set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> calls;
  string local_248 [32];
  Instruction *local_228;
  Instruction *instr;
  const_iterator ed_1;
  const_iterator it_1;
  list<Instruction_*,_std::allocator<Instruction_*>_> instrs;
  Addr addr;
  BlockData *blockData;
  CfgNode *node;
  const_iterator ed;
  const_iterator it;
  list<CfgNode_*,_std::allocator<CfgNode_*>_> nodes;
  int local_1a4;
  stringstream local_1a0 [4];
  int unknown;
  stringstream ss;
  ostream local_190 [384];
  CFG *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a4 = 1;
  std::ostream::operator<<(local_190,std::hex);
  poVar4 = std::operator<<(local_190,"digraph \"0x");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RSI->m_addr);
  poVar4 = std::operator<<(poVar4,"\" {");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_190,"  label = \"0x");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RSI->m_addr);
  poVar4 = std::operator<<(poVar4," (");
  poVar4 = std::operator<<(poVar4,(string *)&in_RSI->m_functionName);
  poVar4 = std::operator<<(poVar4,")\"");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_190,"  labelloc = \"t\"");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_190,"  node[shape=record]");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(local_190,std::endl<char,std::char_traits<char>>);
  nodes_abi_cxx11_((list<CfgNode_*,_std::allocator<CfgNode_*>_> *)&it,in_RSI);
  ed = std::__cxx11::list<CfgNode_*,_std::allocator<CfgNode_*>_>::cbegin
                 ((list<CfgNode_*,_std::allocator<CfgNode_*>_> *)&it);
  node = (CfgNode *)
         std::__cxx11::list<CfgNode_*,_std::allocator<CfgNode_*>_>::cend
                   ((list<CfgNode_*,_std::allocator<CfgNode_*>_> *)&it);
  do {
    bVar1 = std::operator!=(&ed,(_Self *)&node);
    if (!bVar1) {
      poVar4 = std::operator<<(local_190,"}");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::stringstream::str();
      std::__cxx11::list<CfgNode_*,_std::allocator<CfgNode_*>_>::~list
                ((list<CfgNode_*,_std::allocator<CfgNode_*>_> *)&it);
      std::__cxx11::stringstream::~stringstream(local_1a0);
      return this;
    }
    ppCVar5 = std::_List_const_iterator<CfgNode_*>::operator*(&ed);
    this_00 = *ppCVar5;
    TVar2 = CfgNode::type(this_00);
    switch(TVar2) {
    case CFG_ENTRY:
      poVar4 = std::operator<<(local_190,
                               "  Entry [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled]"
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      break;
    case CFG_BLOCK:
      pDVar10 = CfgNode::data(this_00);
      if (pDVar10 == (Data *)0x0) {
        __assert_fail("node->data() != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                      ,0x11c,"std::string CFG::toDOT() const");
      }
      this_02 = (BlockData *)CfgNode::data(this_00);
      AVar12 = CfgNode::Data::addr((Data *)this_02);
      poVar4 = std::operator<<(local_190,"  \"0x");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,AVar12);
      poVar4 = std::operator<<(poVar4,"\" [label=\"{");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(local_190,"    0x");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,AVar12);
      poVar4 = std::operator<<(poVar4," [");
      pvVar6 = (void *)std::ostream::operator<<(poVar4,std::dec);
      iVar3 = CfgNode::BlockData::size(this_02);
      poVar4 = (ostream *)std::ostream::operator<<(pvVar6,iVar3);
      poVar4 = std::operator<<(poVar4,"]\\l");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(local_190,"    | [instrs]\\l");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      __x = CfgNode::BlockData::instructions_abi_cxx11_(this_02);
      std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::list
                ((list<Instruction_*,_std::allocator<Instruction_*>_> *)&it_1,__x);
      ed_1 = std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::cbegin
                       ((list<Instruction_*,_std::allocator<Instruction_*>_> *)&it_1);
      instr = (Instruction *)
              std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::cend
                        ((list<Instruction_*,_std::allocator<Instruction_*>_> *)&it_1);
      while (bVar1 = std::operator!=(&ed_1,(_Self *)&instr), bVar1) {
        ppIVar7 = std::_List_const_iterator<Instruction_*>::operator*(&ed_1);
        local_228 = *ppIVar7;
        poVar4 = std::operator<<(local_190,"    &nbsp;&nbsp;0x");
        pvVar6 = (void *)std::ostream::operator<<(poVar4,std::hex);
        AVar12 = Instruction::addr(local_228);
        poVar4 = (ostream *)std::ostream::operator<<(pvVar6,AVar12);
        poVar4 = std::operator<<(poVar4," \\<+");
        pvVar6 = (void *)std::ostream::operator<<(poVar4,std::dec);
        iVar3 = Instruction::size(local_228);
        poVar4 = (ostream *)std::ostream::operator<<(pvVar6,iVar3);
        poVar4 = std::operator<<(poVar4,"\\>: ");
        Instruction::text_abi_cxx11_(local_228);
        dotFilter(local_248);
        poVar4 = std::operator<<(poVar4,(string *)local_248);
        poVar4 = std::operator<<(poVar4,"\\l");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_248);
        std::_List_const_iterator<Instruction_*>::operator++(&ed_1,0);
      }
      psVar8 = CfgNode::BlockData::calls(this_02);
      std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::set
                ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&it_2,psVar8);
      bVar1 = std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::empty
                        ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&it_2);
      if (!bVar1) {
        poVar4 = std::operator<<(local_190,"     | [calls]\\l");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(local_190,std::hex);
        ed_2._M_node = (_Base_ptr)
                       std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::cbegin
                                 ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&it_2);
        called = (CFG *)std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::cend
                                  ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&it_2);
        while (bVar1 = std::operator!=(&ed_2,(_Self *)&called), bVar1) {
          ppCVar9 = std::_Rb_tree_const_iterator<CFG_*>::operator*(&ed_2);
          local_298 = *ppCVar9;
          poVar4 = std::operator<<(local_190,"     &nbsp;&nbsp;0x");
          AVar12 = CFG::addr(local_298);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,AVar12);
          poVar4 = std::operator<<(poVar4," (");
          functionName_abi_cxx11_(local_298);
          dotFilter(local_2b8);
          poVar4 = std::operator<<(poVar4,(string *)local_2b8);
          poVar4 = std::operator<<(poVar4,")\\l");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_2b8);
          std::_Rb_tree_const_iterator<CFG_*>::operator++(&ed_2,0);
        }
      }
      poVar4 = std::operator<<(local_190,"  }\"]");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      bVar1 = CfgNode::BlockData::isIndirect(this_02);
      if (bVar1) {
        poVar4 = std::operator<<(local_190,"  \"Unknown");
        pvVar6 = (void *)std::ostream::operator<<(poVar4,std::dec);
        poVar4 = (ostream *)std::ostream::operator<<(pvVar6,local_1a4);
        poVar4 = std::operator<<(poVar4,"\" [label=\"?\", shape=none]");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(local_190,"  \"0x");
        pvVar6 = (void *)std::ostream::operator<<(poVar4,std::hex);
        AVar12 = CfgNode::Data::addr((Data *)this_02);
        poVar4 = (ostream *)std::ostream::operator<<(pvVar6,AVar12);
        poVar4 = std::operator<<(poVar4,"\" -> \"Unknown");
        pvVar6 = (void *)std::ostream::operator<<(poVar4,std::dec);
        poVar4 = (ostream *)std::ostream::operator<<(pvVar6,local_1a4);
        poVar4 = std::operator<<(poVar4,"\" [style=dashed]");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        local_1a4 = local_1a4 + 1;
      }
      std::ostream::operator<<(local_190,std::hex);
      std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::~set
                ((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&it_2);
      std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::~list
                ((list<Instruction_*,_std::allocator<Instruction_*>_> *)&it_1);
      break;
    case CFG_PHANTOM:
      pDVar10 = CfgNode::data(this_00);
      if (pDVar10 == (Data *)0x0) {
        __assert_fail("node->data() != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                      ,0x145,"std::string CFG::toDOT() const");
      }
      pDVar10 = CfgNode::data(this_00);
      poVar4 = std::operator<<(local_190,"  \"0x");
      AVar12 = CfgNode::Data::addr(pDVar10);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,AVar12);
      poVar4 = std::operator<<(poVar4,"\" [label=\"{");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(local_190,"     0x");
      AVar12 = CfgNode::Data::addr(pDVar10);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,AVar12);
      poVar4 = std::operator<<(poVar4,"\\l");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(local_190,"  }\", style=dashed]");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      break;
    case CFG_EXIT:
      poVar4 = std::operator<<(local_190,
                               "  Exit [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled,peripheries=2]"
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      break;
    case CFG_HALT:
      poVar4 = std::operator<<(local_190,
                               "  Halt [label=\"\",width=0.3,height=0.3,shape=square,fillcolor=black,style=filled,peripheries=2]"
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                    ,0x14f,"std::string CFG::toDOT() const");
    }
    psVar11 = CfgNode::successors(this_00);
    std::set<CfgNode::Edge,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_>::set
              ((set<CfgNode::Edge,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_> *)&it_3
               ,psVar11);
    ed_3 = std::set<CfgNode::Edge,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_>::begin
                     ((set<CfgNode::Edge,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_>
                       *)&it_3);
    succ = (CfgNode *)
           std::set<CfgNode::Edge,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_>::end
                     ((set<CfgNode::Edge,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_>
                       *)&it_3);
    while (bVar1 = std::operator!=(&ed_3,(_Self *)&succ), bVar1) {
      TVar2 = CfgNode::type(this_00);
      if (TVar2 == CFG_ENTRY) {
        std::operator<<(local_190,"  Entry -> ");
      }
      else {
        if (1 < TVar2 - CFG_BLOCK) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                        ,0x15e,"std::string CFG::toDOT() const");
        }
        poVar4 = std::operator<<(local_190,"  \"0x");
        AVar12 = CfgNode::node2addr(this_00);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,AVar12);
        std::operator<<(poVar4,"\" -> ");
      }
      pEVar13 = std::_Rb_tree_const_iterator<CfgNode::Edge>::operator->(&ed_3);
      this_01 = pEVar13->node;
      TVar2 = CfgNode::type(this_01);
      switch(TVar2) {
      case CFG_ENTRY:
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                      ,0x16f,"std::string CFG::toDOT() const");
      case CFG_BLOCK:
      case CFG_PHANTOM:
        poVar4 = std::operator<<(local_190,"\"0x");
        AVar12 = CfgNode::node2addr(this_01);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,AVar12);
        std::operator<<(poVar4,"\"");
        break;
      case CFG_EXIT:
        std::operator<<(local_190,"Exit");
        break;
      case CFG_HALT:
        std::operator<<(local_190,"Halt");
      }
      std::ostream::operator<<(local_190,std::endl<char,std::char_traits<char>>);
      std::_Rb_tree_const_iterator<CfgNode::Edge>::operator++(&ed_3,0);
    }
    std::set<CfgNode::Edge,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_>::~set
              ((set<CfgNode::Edge,_std::less<CfgNode::Edge>,_std::allocator<CfgNode::Edge>_> *)&it_3
              );
    std::_List_const_iterator<CfgNode_*>::operator++(&ed,0);
  } while( true );
}

Assistant:

std::string CFG::toDOT() const {
	std::stringstream ss;
	int unknown = 1;

	ss << std::hex;
	ss << "digraph \"0x" << m_addr << "\" {" << std::endl;
	ss << "  label = \"0x" << m_addr << " (" << m_functionName << ")\"" << std::endl;
    ss << "  labelloc = \"t\"" << std::endl;
    ss << "  node[shape=record]" << std::endl;
    ss << std::endl;

	std::list<CfgNode*> nodes = this->nodes();
	for (std::list<CfgNode*>::const_iterator it = nodes.cbegin(),
			ed = nodes.cend(); it != ed; it++) {
		CfgNode* node = *it;
		switch (node->type()) {
			case CfgNode::CFG_ENTRY:
			    ss << "  Entry [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled]" << std::endl;
			    break;
			case CfgNode::CFG_EXIT:
				ss << "  Exit [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled,peripheries=2]" << std::endl;
			    break;
			case CfgNode::CFG_HALT:
				ss << "  Halt [label=\"\",width=0.3,height=0.3,shape=square,fillcolor=black,style=filled,peripheries=2]" << std::endl;
			    break;
			case CfgNode::CFG_BLOCK: {
				assert(node->data() != 0);
				CfgNode::BlockData* blockData = static_cast<CfgNode::BlockData*>(node->data());

				Addr addr =  blockData->addr();
				ss << "  \"0x" << addr << "\" [label=\"{" << std::endl;
				ss << "    0x" << addr << " [" << std::dec << blockData->size() << "]\\l" << std::endl;
				ss << "    | [instrs]\\l" << std::endl;

				std::list<Instruction*> instrs = blockData->instructions();
				for (std::list<Instruction*>::const_iterator it = instrs.cbegin(), ed = instrs.cend();
						it != ed; it++) {
					Instruction* instr = *it;
					ss << "    &nbsp;&nbsp;0x" << std::hex << instr->addr() << " \\<+"
							<< std::dec << instr->size() << "\\>: " << dotFilter(instr->text())
							<< "\\l" << std::endl;
				}

				std::set<CFG*> calls = blockData->calls();
				if (!calls.empty()) {
					ss << "     | [calls]\\l" << std::endl;
					ss << std::hex;
					for (std::set<CFG*>::const_iterator it = calls.cbegin(), ed = calls.cend();
							it != ed; it++) {
						CFG* called = *it;
						ss << "     &nbsp;&nbsp;0x" << called->addr() << " ("
							<< dotFilter(called->functionName()) << ")\\l" << std::endl;
					}
				}

				ss << "  }\"]" << std::endl;

                if (blockData->isIndirect()) {
                		ss << "  \"Unknown" << std::dec << unknown << "\" [label=\"?\", shape=none]" << std::endl;
                		ss << "  \"0x" << std::hex << blockData->addr() << "\" -> \"Unknown" << std::dec << unknown << "\" [style=dashed]" << std::endl;
                    unknown++;
                }

				ss << std::hex;
				break;
			}
			case CfgNode::CFG_PHANTOM: {
				assert(node->data() != 0);
				CfgNode::PhantomData* phantomData = static_cast<CfgNode::PhantomData*>(node->data());

				ss << "  \"0x" << phantomData->addr() << "\" [label=\"{" << std::endl;
				ss << "     0x" << phantomData->addr() << "\\l" << std::endl;
				ss << "  }\", style=dashed]" << std::endl;

				break;
			}
			default:
				assert(false);
		}

		std::set<CfgNode::Edge> succs = node->successors();
		for (std::set<CfgNode::Edge>::iterator it = succs.begin(), ed = succs.end();
				it != ed; it++) {
			switch (node->type()) {
				case CfgNode::CFG_ENTRY:
					ss << "  Entry -> ";
					break;
				case CfgNode::CFG_BLOCK:
				case CfgNode::CFG_PHANTOM:
					ss << "  \"0x" << CfgNode::node2addr(node) << "\" -> ";
					break;
				default:
					assert(false);
			}

			CfgNode* succ = it->node;
			switch (succ->type()) {
				case CfgNode::CFG_EXIT:
					ss << "Exit";
					break;
				case CfgNode::CFG_HALT:
					ss << "Halt";
					break;
				case CfgNode::CFG_BLOCK:
				case CfgNode::CFG_PHANTOM:
					ss << "\"0x" << CfgNode::node2addr(succ) << "\"";
					break;
				case CfgNode::CFG_ENTRY:
				default:
					assert(false);
			}

			ss << std::endl;
		}
	}
	ss << "}" << std::endl;

	return ss.str();
}